

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O0

SubcaseBasePtr deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicStdLayoutCase3CS>(void)

{
  BasicStdLayoutCase3CS *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (BasicStdLayoutCase3CS *)operator_new(0x50);
  (this->super_BasicStdLayoutBase2CS).m_buffer[5] = 0;
  (this->super_BasicStdLayoutBase2CS).m_buffer[6] = 0;
  *(undefined8 *)((this->super_BasicStdLayoutBase2CS).m_buffer + 7) = 0;
  (this->super_BasicStdLayoutBase2CS).m_buffer[1] = 0;
  (this->super_BasicStdLayoutBase2CS).m_buffer[2] = 0;
  (this->super_BasicStdLayoutBase2CS).m_buffer[3] = 0;
  (this->super_BasicStdLayoutBase2CS).m_buffer[4] = 0;
  (this->super_BasicStdLayoutBase2CS).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
  super_GLWrapper.m_context = (Context *)0x0;
  (this->super_BasicStdLayoutBase2CS).m_program = 0;
  (this->super_BasicStdLayoutBase2CS).m_buffer[0] = 0;
  (this->super_BasicStdLayoutBase2CS).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
  super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_BasicStdLayoutBase2CS).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
    super_GLWrapper.super_CallLogWrapper.m_enableLog = 0;
  (this->super_BasicStdLayoutBase2CS).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
  super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  (this->super_BasicStdLayoutBase2CS).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
  super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  gl4cts::anon_unknown_0::BasicStdLayoutCase3CS::BasicStdLayoutCase3CS(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}